

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::LE_Detonation_PDU::Decode(LE_Detonation_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  anon_union_1_2_647d7bf6_for_m_DetonationFlag1Union *V;
  LE_EntityIdentifier *pLVar1;
  MunitionDescriptor *this_00;
  KUINT8 KVar2;
  byte bVar3;
  KUINT16 KVar4;
  KException *this_01;
  int iVar5;
  undefined7 in_register_00000011;
  KUINT16 tmp;
  unsigned_short local_52;
  undefined1 local_50 [32];
  
  KVar4 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (0x27 < iVar5 + (uint)KVar4) {
    LE_Header::Decode(&this->super_LE_Header,stream,ignoreHeader);
    V = &this->m_DetonationFlag1Union;
    KDataStream::Read(stream,&V->m_ui8Flag);
    bVar3 = (this->m_DetonationFlag1Union).m_ui8Flag;
    if ((char)bVar3 < '\0') {
      KDataStream::Read(stream,&(this->m_DetonationFlag2Union).m_ui8Flag);
      bVar3 = V->m_ui8Flag;
    }
    else {
      (this->m_DetonationFlag2Union).m_ui8Flag = '\0';
    }
    if ((bVar3 & 1) != 0) {
      (*(this->m_TargetID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_TargetID,stream);
      bVar3 = (this->m_DetonationFlag1Union).m_ui8Flag;
    }
    local_52 = 0;
    if ((bVar3 & 4) != 0) {
      pLVar1 = &this->m_MunitionID;
      if ((bVar3 & 2) == 0) {
        KVar2 = (this->super_LE_Header).m_EntID.m_ui8ApplicationID;
        KVar4 = (this->super_LE_Header).m_EntID.m_ui16EntityID;
        (this->m_MunitionID).m_ui8SiteID = (this->super_LE_Header).m_EntID.m_ui8SiteID;
        (this->m_MunitionID).m_ui8ApplicationID = KVar2;
        (this->m_MunitionID).m_ui16EntityID = KVar4;
        KDataStream::Read<unsigned_short>(stream,&local_52);
        DATA_TYPE::LE_EntityIdentifier::SetEntityID(pLVar1,local_52);
      }
      else {
        (*(pLVar1->super_DataTypeBase)._vptr_DataTypeBase[3])(pLVar1,stream);
      }
    }
    if (((this->m_DetonationFlag2Union).m_ui8Flag & 2) != 0) {
      pLVar1 = &this->m_EventID;
      if (((this->m_DetonationFlag1Union).m_ui8Flag & 8) == 0) {
        KVar2 = (this->super_LE_Header).m_EntID.m_ui8ApplicationID;
        KVar4 = (this->super_LE_Header).m_EntID.m_ui16EntityID;
        (this->m_EventID).m_ui8SiteID = (this->super_LE_Header).m_EntID.m_ui8SiteID;
        (this->m_EventID).m_ui8ApplicationID = KVar2;
        (this->m_EventID).m_ui16EntityID = KVar4;
        KDataStream::Read<unsigned_short>(stream,&local_52);
        DATA_TYPE::LE_EntityIdentifier::SetEntityID(pLVar1,local_52);
      }
      else {
        (*(pLVar1->super_DataTypeBase)._vptr_DataTypeBase[3])(pLVar1,stream);
      }
    }
    if ((V->m_ui8Flag & 0x40) == 0) {
      (*(this->m_LocWrldCoord).super_DataTypeBase._vptr_DataTypeBase[3])
                (&this->m_LocWrldCoord,stream);
    }
    (*(this->m_Vel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Vel,stream);
    if (((this->m_DetonationFlag2Union).m_ui8Flag & 1) != 0) {
      (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
    }
    this_00 = &this->m_MunitionDesc;
    DATA_TYPE::EntityType::EntityType((EntityType *)local_50,stream);
    DATA_TYPE::Descriptor::SetType(&this_00->super_Descriptor,(EntityType *)local_50);
    DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)local_50);
    bVar3 = V->m_ui8Flag;
    if ((bVar3 & 0x10) != 0) {
      KDataStream::Read<unsigned_short>(stream,&local_52);
      DATA_TYPE::MunitionDescriptor::SetWarhead(this_00,(uint)local_52);
      KDataStream::Read<unsigned_short>(stream,&local_52);
      DATA_TYPE::MunitionDescriptor::SetFuse(this_00,(uint)local_52);
      bVar3 = V->m_ui8Flag;
    }
    if ((bVar3 & 0x20) != 0) {
      KDataStream::Read<unsigned_short>(stream,&local_52);
      DATA_TYPE::MunitionDescriptor::SetQuantity(this_00,local_52);
      KDataStream::Read<unsigned_short>(stream,&local_52);
      DATA_TYPE::MunitionDescriptor::SetRate(this_00,local_52);
      bVar3 = V->m_ui8Flag;
    }
    if ((bVar3 & 0x40) != 0) {
      (*(this->m_LocEntCoord).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_LocEntCoord,stream)
      ;
    }
    KDataStream::Read(stream,&this->m_ui8DetonationResult);
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Decode","");
  KException::KException(this_01,(KString *)local_50,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void LE_Detonation_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < LE_DETONATION_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    LE_Header::Decode( stream, ignoreHeader );

    stream >> m_DetonationFlag1Union.m_ui8Flag;

    // F7: Flag Octet 2
    if( m_DetonationFlag1Union.m_ui8Flag2 )
    {
        stream >> m_DetonationFlag2Union.m_ui8Flag;
    }
    else
    {
        // Make sure no flags are set in Flag Octet 2
        m_DetonationFlag2Union.m_ui8Flag = 0;
    }

    // F0: Target Entity ID
    if( m_DetonationFlag1Union.m_ui8TargetId )
    {
        stream >> KDIS_STREAM m_TargetID;
    }

    KUINT16 tmp = 0;

    // F2: Munition ID
    if( m_DetonationFlag1Union.m_ui8MunitionId )
    {
        // F1: Site Number and Application Number
        if( m_DetonationFlag1Union.m_ui8MunitionSiteApp )
        {
            stream >> KDIS_STREAM m_MunitionID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.

            // The Firing Entities site and application id are the same so lets copy them over
            m_MunitionID = m_EntID;

            stream >> tmp;
            m_MunitionID.SetEntityID( tmp );
        }
    }

    // G1: Event Number
    if( m_DetonationFlag2Union.m_ui8EventNum )
    {
        // F3: Event ID
        if( m_DetonationFlag1Union.m_ui8EventSiteAppId )
        {
            stream >> KDIS_STREAM m_EventID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.

            // The Firing Entities site and application id are the same so lets copy them over
            m_EventID = m_EntID;

            stream >> tmp;
            m_EventID.SetEntityID( tmp );
        }
    }

    // F6: Is the location in world coordinates?
    if( !m_DetonationFlag1Union.m_ui8LocationTyp ) // false means location is in world coords
    {
        stream >> KDIS_STREAM m_LocWrldCoord;
    }

    // Velocity
    stream >> KDIS_STREAM m_Vel;

    // G0: Munition Orientation
    if( m_DetonationFlag2Union.m_ui8MunitionOri )
    {
        stream >> KDIS_STREAM m_Ori;
    }

    // Munition Descriptor
    m_MunitionDesc.SetType( EntityType( stream ) );
    // F4: Warhead and Fuse fields of the Munition Descriptor record
    if( m_DetonationFlag1Union.m_ui8WarheadFuse )
    {
        stream >> tmp;
        m_MunitionDesc.SetWarhead( ( WarheadType )tmp );

        stream >> tmp;
        m_MunitionDesc.SetFuse( ( FuseType )tmp );
    }
    // F5: Quantity and Rate fields of the Munition Descriptor record
    if( m_DetonationFlag1Union.m_ui8QuantRate )
    {
        stream >> tmp;
        m_MunitionDesc.SetQuantity( tmp );

        stream >> tmp;
        m_MunitionDesc.SetRate( tmp );
    }

    // F6: Is the location in entity coordinates?
    if( m_DetonationFlag1Union.m_ui8LocationTyp ) // true means location is in entity coords
    {
        stream >> KDIS_STREAM m_LocEntCoord;
    }

    // Detonation Result
    stream >> m_ui8DetonationResult;
}